

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O1

void __thiscall icu_63::Package::~Package(Package *this)

{
  long lVar1;
  long lVar2;
  
  uprv_free_63(this->inData);
  if (0 < this->itemCount) {
    lVar1 = 0x14;
    lVar2 = 0;
    do {
      if (*(char *)((long)&this->items->name + lVar1) != '\0') {
        uprv_free_63(*(void **)((long)this->items + lVar1 + -0xc));
      }
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (lVar2 < this->itemCount);
  }
  uprv_free_63(this->items);
  return;
}

Assistant:

Package::~Package() {
    int32_t idx;

    uprv_free(inData);

    for(idx=0; idx<itemCount; ++idx) {
        if(items[idx].isDataOwned) {
            uprv_free(items[idx].data);
        }
    }

    uprv_free((void*)items);
}